

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGA.hpp
# Opt level: O0

void __thiscall
PCCompatible::CGA::CRTCOutputter::perform_bus_cycle_phase1(CRTCOutputter *this,BusState *state)

{
  uint8_t *puVar1;
  int local_20;
  OutputState local_1c;
  BusState *pBStack_18;
  OutputState new_state;
  BusState *state_local;
  CRTCOutputter *this_local;
  
  pBStack_18 = state;
  state_local = (BusState *)this;
  update_hsync(this,(bool)(state->hsync & 1));
  local_1c = implied_state(this,pBStack_18);
  if ((((local_1c != this->output_state) || (this->active_pixels_per_tick != this->pixels_per_tick))
      || (this->active_clock_divider != this->clock_divider)) ||
     ((this->active_border_colour != this->border_colour || (0x390 < this->count)))) {
    if (this->count != 0) {
      switch(this->output_state) {
      case Sync:
        Outputs::CRT::CRT::output_sync(&this->crt,this->count * this->active_clock_divider);
        break;
      case Pixels:
        flush_pixels(this);
        break;
      case Border:
        if (this->active_border_colour == '\0') {
          Outputs::CRT::CRT::output_level<unsigned_char>
                    (&this->crt,this->count * this->active_clock_divider,this->active_border_colour)
          ;
        }
        else {
          Outputs::CRT::CRT::output_blank(&this->crt,this->count * this->active_clock_divider);
        }
        break;
      case ColourBurst:
        Outputs::CRT::CRT::output_colour_burst
                  (&this->crt,this->count * this->active_clock_divider,200,false,')');
      }
    }
    this->output_state = local_1c;
    this->active_pixels_per_tick = this->pixels_per_tick;
    this->active_clock_divider = this->clock_divider;
    this->active_border_colour = this->border_colour;
    this->count = 0;
  }
  if (this->output_state == Pixels) {
    if (this->pixels == (uint8_t *)0x0) {
      puVar1 = Outputs::CRT::CRT::begin_data(&this->crt,0x140,1);
      this->pixels = puVar1;
      this->pixel_pointer = puVar1;
      if ((this->pixels != (uint8_t *)0x0) && (this->count != 0)) {
        Outputs::CRT::CRT::output_blank(&this->crt,this->count * this->active_clock_divider);
        this->count = 0;
      }
    }
    if (this->pixels != (uint8_t *)0x0) {
      if ((pBStack_18->cursor & 1U) == 0) {
        if (this->mode_ == Text) {
          serialise_text(this,pBStack_18);
        }
        else {
          serialise_pixels(this,pBStack_18);
        }
      }
      else {
        local_20 = 0x3f;
        std::fill<unsigned_char*,int>
                  (this->pixel_pointer,this->pixel_pointer + this->pixels_per_tick,&local_20);
      }
      this->pixel_pointer = this->pixel_pointer + this->active_pixels_per_tick;
    }
  }
  this->count = this->count + 8;
  if ((this->output_state == Pixels) && (this->pixel_pointer == this->pixels + 0x140)) {
    flush_pixels(this);
    this->count = 0;
  }
  return;
}

Assistant:

void perform_bus_cycle_phase1(const Motorola::CRTC::BusState &state) {
				// Determine new output state.
				update_hsync(state.hsync);
				const OutputState new_state = implied_state(state);
				static constexpr uint8_t colour_phase = 200;

				// Upon either a state change or just having accumulated too much local time...
				if(
					new_state != output_state ||
					active_pixels_per_tick != pixels_per_tick ||
					active_clock_divider != clock_divider ||
					active_border_colour != border_colour ||
					count > 912
				) {
					// (1) flush preexisting state.
					if(count) {
						switch(output_state) {
							case OutputState::Sync:			crt.output_sync(count * active_clock_divider);							break;
							case OutputState::Border:
								if(active_border_colour) {
									crt.output_blank(count * active_clock_divider);
								} else {
									crt.output_level<uint8_t>(count * active_clock_divider, active_border_colour);
								}
							break;
							case OutputState::ColourBurst:	crt.output_colour_burst(count * active_clock_divider, colour_phase);	break;
							case OutputState::Pixels:		flush_pixels();															break;
						}
					}

					// (2) adopt new state.
					output_state = new_state;
					active_pixels_per_tick = pixels_per_tick;
					active_clock_divider = clock_divider;
					active_border_colour = border_colour;
					count = 0;
				}

				// Collect pixels if applicable.
				if(output_state == OutputState::Pixels) {
					if(!pixels) {
						pixel_pointer = pixels = crt.begin_data(DefaultAllocationSize);

						// Flush any period where pixels weren't recorded due to back pressure.
						if(pixels && count) {
							crt.output_blank(count * active_clock_divider);
							count = 0;
						}
					}

					if(pixels) {
						if(state.cursor) {
							std::fill(pixel_pointer, pixel_pointer + pixels_per_tick, 0x3f); // i.e. white.
						} else {
							if(mode_ == Mode::Text) {
								serialise_text(state);
							} else {
								serialise_pixels(state);
							}
						}
						pixel_pointer += active_pixels_per_tick;
					}
				}

				// Advance.
				count += 8;

				// Output pixel row prematurely if storage is exhausted.
				if(output_state == OutputState::Pixels && pixel_pointer == pixels + DefaultAllocationSize) {
					flush_pixels();
					count = 0;
				}
			}